

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManCrossCut(Gia_Man_t *p,int fReverse)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int *__ptr;
  ulong uVar5;
  Vec_Int_t *__ptr_00;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  __ptr_00 = Gia_ManDfsForCrossCut(p,fReverse);
  iVar3 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar3 < 1) {
    iVar7 = 0;
    if (__ptr == (int *)0x0) goto LAB_007902e9;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    iVar8 = 0;
    do {
      iVar4 = __ptr[lVar6];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar4;
      iVar8 = (iVar8 + 1) - (uint)(pGVar1->Value == 0);
      if (iVar7 <= iVar8) {
        iVar7 = iVar8;
      }
      uVar5 = *(ulong *)pGVar1;
      uVar9 = uVar5 & 0x1fffffff;
      if (uVar9 == 0x1fffffff || (int)uVar5 < 0) {
        if ((int)uVar5 < 0 && (int)uVar9 != 0x1fffffff) goto LAB_007902b9;
      }
      else {
        puVar2 = &pGVar1[-uVar9].Value;
        *puVar2 = *puVar2 - 1;
        iVar8 = iVar8 - (uint)(*puVar2 == 0);
        uVar9 = (ulong)((uint)(uVar5 >> 0x20) & 0x1fffffff);
LAB_007902b9:
        puVar2 = &pGVar1[-uVar9].Value;
        *puVar2 = *puVar2 - 1;
        iVar8 = iVar8 - (uint)(*puVar2 == 0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar3 != lVar6);
  }
  free(__ptr);
LAB_007902e9:
  free(__ptr_00);
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar6 = 0;
    do {
      if (*(int *)((long)&p->pObjs->Value + lVar6) != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x34f,"int Gia_ManCrossCut(Gia_Man_t *, int)");
      }
      lVar6 = lVar6 + 0xc;
    } while ((ulong)(uint)p->nObjs * 0xc != lVar6);
  }
  return iVar7;
}

Assistant:

int Gia_ManCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    vNodes = Gia_ManDfsForCrossCut( p, fReverse );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
    Vec_IntFree( vNodes );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    return nCutMax;
}